

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineParser.cpp
# Opt level: O2

void __thiscall CommandLineParser::CommandLineParser(CommandLineParser *this,int argc,char **argv)

{
  long lVar1;
  allocator<char> local_69;
  string *local_68;
  PlugIns *local_60;
  CommandLineParser *local_58;
  string argument;
  
  this->_vptr_CommandLineParser = (_func_int **)&PTR__CommandLineParser_0010bd18;
  this->m_useCompiler = false;
  this->m_useXml = false;
  (this->m_xmlFileName)._M_dataplus._M_p = (pointer)&(this->m_xmlFileName).field_2;
  (this->m_xmlFileName)._M_string_length = 0;
  (this->m_xmlFileName).field_2._M_local_buf[0] = '\0';
  (this->m_xsl)._M_dataplus._M_p = (pointer)&(this->m_xsl).field_2;
  (this->m_xsl)._M_string_length = 0;
  (this->m_xsl).field_2._M_local_buf[0] = '\0';
  (this->m_encoding)._M_dataplus._M_p = (pointer)&(this->m_encoding).field_2;
  (this->m_encoding)._M_string_length = 0;
  (this->m_encoding).field_2._M_local_buf[0] = '\0';
  this->m_waitBeforeExit = false;
  this->m_briefProgress = false;
  this->m_noProgress = false;
  this->m_useText = false;
  this->m_useCout = false;
  (this->m_testPath)._M_dataplus._M_p = (pointer)&(this->m_testPath).field_2;
  (this->m_testPath)._M_string_length = 0;
  (this->m_testPath).field_2._M_local_buf[0] = '\0';
  local_58 = this;
  std::_Deque_base<CommandLinePlugInInfo,_std::allocator<CommandLinePlugInInfo>_>::_Deque_base
            (&(this->m_plugIns).
              super__Deque_base<CommandLinePlugInInfo,_std::allocator<CommandLinePlugInInfo>_>);
  local_60 = &this->m_plugIns;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Deque_base(&(this->m_arguments).
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
  this->m_currentArgument = 0;
  local_68 = &this->m_option;
  (this->m_option)._M_dataplus._M_p = (pointer)&(this->m_option).field_2;
  (this->m_option)._M_string_length = 0;
  (this->m_option).field_2._M_local_buf[0] = '\0';
  for (lVar1 = 1; lVar1 < argc; lVar1 = lVar1 + 1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&argument,argv[lVar1],&local_69);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->m_arguments,&argument);
    std::__cxx11::string::~string((string *)&argument);
  }
  return;
}

Assistant:

CommandLineParser::CommandLineParser( int argc, 
                                      const char *argv[] )
    : m_useCompiler( false )
    , m_useXml( false )
    , m_briefProgress( false )
    , m_noProgress( false )
    , m_useText( false )
    , m_useCout( false )
    , m_waitBeforeExit( false )
    , m_currentArgument( 0 )
{
  for ( int index =1; index < argc; ++index )
  {
    std::string argument( argv[index ] );
    m_arguments.push_back( argument );
  }
}